

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::setSize
          (Image<float,_gimage::PixelTraits<float>_> *this,long w,long h,long d)

{
  ulong uVar1;
  float *pfVar2;
  float **ppfVar3;
  float ***pppfVar4;
  long lVar5;
  runtime_error *this_00;
  uint uVar6;
  ulong uVar7;
  
  if (((this->width != w) || (this->height != h)) || (this->depth != d)) {
    if (this->n < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Cannot change size, because image is used as a wrapper");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->pixel != (float *)0x0) {
      operator_delete__(this->pixel);
    }
    if (this->row != (float **)0x0) {
      operator_delete__(this->row);
    }
    if (this->img != (float ***)0x0) {
      operator_delete__(this->img);
    }
    uVar6 = (uint)d;
    this->depth = uVar6;
    this->width = w;
    this->height = h;
    uVar1 = h * w * (long)(int)uVar6;
    this->n = uVar1;
    this->pixel = (float *)0x0;
    this->row = (float **)0x0;
    this->img = (float ***)0x0;
    if (0 < (long)uVar1) {
      uVar7 = (int)uVar6 * h;
      pfVar2 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
      this->pixel = pfVar2;
      ppfVar3 = (float **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
      this->row = ppfVar3;
      uVar1 = 0xffffffffffffffff;
      if (-1 < (int)uVar6) {
        uVar1 = (d << 0x20) >> 0x1d;
      }
      pppfVar4 = (float ***)operator_new__(uVar1);
      this->img = pppfVar4;
      *ppfVar3 = pfVar2;
      if (1 < (long)uVar7) {
        lVar5 = 1;
        do {
          this->row[lVar5] = this->row[lVar5 + -1] + w;
          lVar5 = lVar5 + 1;
        } while (uVar7 - lVar5 != 0);
        ppfVar3 = this->row;
        pppfVar4 = this->img;
      }
      *pppfVar4 = ppfVar3;
      if (1 < (int)uVar6) {
        uVar1 = 1;
        do {
          this->img[uVar1] = this->img[uVar1 - 1] + h;
          uVar1 = uVar1 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar1);
      }
    }
  }
  return;
}

Assistant:

void setSize(long w, long h, long d)
    {
      if (width != w || height != h || depth != d)
      {
        if (n < 0)
        {
          throw std::runtime_error("Cannot change size, because image is used as a wrapper");
        }

        if (pixel != 0)
        {
          delete [] pixel;
        }

        if (row != 0)
        {
          delete [] row;
        }

        if (img != 0)
        {
          delete [] img;
        }

        depth=d;
        width=w;
        height=h;
        n=width*height*depth;

        pixel=0;
        row=0;
        img=0;

        if (n > 0)
        {
          long m=height*depth;

          pixel=new T[n];
          row=new T*[m];
          img=new T **[depth];

          row[0]=pixel;

          for (long k=1; k<m; k++)
          {
            row[k]=row[k-1]+width;
          }

          img[0]=row;

          for (int j=1; j<depth; j++)
          {
            img[j]=img[j-1]+height;
          }
        }
      }
    }